

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpainter.cpp
# Opt level: O3

QRegion __thiscall QPainter::clipRegion(QPainter *this)

{
  QPainterPathPrivate *pQVar1;
  QPainterPathPrivate *pQVar2;
  _Head_base<0UL,_QPainterPrivate_*,_false> _Var3;
  bool bVar4;
  bool bVar5;
  FillRule FVar6;
  TransformationType TVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  bool bVar12;
  long *in_RSI;
  QRect *r;
  qreal *pqVar13;
  QTransform *pQVar14;
  QRegion *this_00;
  long lVar15;
  QTransform *pQVar16;
  QPainterPath *this_01;
  long in_FS_OFFSET;
  byte bVar17;
  double dVar18;
  double dVar19;
  QTransform matrix;
  undefined1 local_118 [32];
  undefined1 local_f8 [32];
  QTransform local_d8;
  QTransform local_88;
  long local_38;
  
  bVar17 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar11 = *in_RSI;
  if (*(long *)(lVar11 + 0x118) == 0) {
    clipRegion();
  }
  else {
    (this->d_ptr)._M_t.super___uniq_ptr_impl<QPainterPrivate,_std::default_delete<QPainterPrivate>_>
    ._M_t.super__Tuple_impl<0UL,_QPainterPrivate_*,_std::default_delete<QPainterPrivate>_>.
    super__Head_base<0UL,_QPainterPrivate_*,_false>._M_head_impl =
         (QPainterPrivate *)&DAT_aaaaaaaaaaaaaaaa;
    QRegion::QRegion((QRegion *)this);
    if ((*(byte *)(lVar11 + 0xf8) & 1) == 0) {
      lVar15 = *in_RSI;
      *(byte *)(lVar15 + 0xf8) = *(byte *)(lVar15 + 0xf8) | 1;
      QTransform::inverted(&local_88,(QTransform *)(*(long *)(lVar15 + 0x40) + 0xd8),(bool *)0x0);
      pQVar16 = &local_88;
      pqVar13 = (qreal *)(lVar15 + 0xa8);
      for (lVar10 = 9; lVar10 != 0; lVar10 = lVar10 + -1) {
        *pqVar13 = pQVar16->m_matrix[0][0];
        pQVar16 = (QTransform *)((long)pQVar16 + ((ulong)bVar17 * -2 + 1) * 8);
        pqVar13 = pqVar13 + (ulong)bVar17 * -2 + 1;
      }
      *(undefined2 *)(lVar15 + 0xf0) = local_88._72_2_;
    }
    lVar15 = *(long *)(*(long *)(lVar11 + 0x40) + 0x80);
    if (lVar15 != 0) {
      pQVar16 = (QTransform *)(lVar11 + 0xa8);
      lVar15 = lVar15 * 0xa0;
      this_01 = (QPainterPath *)(*(long *)(*(long *)(lVar11 + 0x40) + 0x78) + 0x60);
      bVar12 = true;
      do {
        switch(*(undefined4 *)&this_01[-0xc].d_ptr.d.ptr) {
        case 0:
          pqVar13 = (qreal *)&DAT_0069f5a8;
          pQVar14 = &local_88;
          for (lVar11 = 10; lVar11 != 0; lVar11 = lVar11 + -1) {
            pQVar14->m_matrix[0][0] = *pqVar13;
            pqVar13 = pqVar13 + (ulong)bVar17 * -2 + 1;
            pQVar14 = (QTransform *)((long)pQVar14 + ((ulong)bVar17 * -2 + 1) * 8);
          }
          QTransform::operator*(&local_88,(QTransform *)(this_01 + -0xb),pQVar16);
          if (bVar12) {
            QTransform::map(&local_d8,(QRegion *)&local_88);
            _Var3._M_head_impl =
                 (this->d_ptr)._M_t.
                 super___uniq_ptr_impl<QPainterPrivate,_std::default_delete<QPainterPrivate>_>._M_t.
                 super__Tuple_impl<0UL,_QPainterPrivate_*,_std::default_delete<QPainterPrivate>_>.
                 super__Head_base<0UL,_QPainterPrivate_*,_false>._M_head_impl;
            (this->d_ptr)._M_t.
            super___uniq_ptr_impl<QPainterPrivate,_std::default_delete<QPainterPrivate>_>._M_t.
            super__Tuple_impl<0UL,_QPainterPrivate_*,_std::default_delete<QPainterPrivate>_>.
            super__Head_base<0UL,_QPainterPrivate_*,_false>._M_head_impl =
                 (QPainterPrivate *)local_d8.m_matrix[0][0];
            local_d8.m_matrix[0][0] = (qreal)_Var3._M_head_impl;
            QRegion::~QRegion((QRegion *)&local_d8);
            bVar12 = false;
          }
          else {
            iVar8 = *(int *)&this_01[-1].d_ptr.d.ptr;
            if (iVar8 == 0) {
LAB_003d18f5:
              QRegion::QRegion((QRegion *)&local_d8);
              goto LAB_003d1902;
            }
            if (iVar8 == 2) {
              QTransform::map(&local_d8,(QRegion *)&local_88);
              QRegion::operator&=((QRegion *)this,(QRegion *)&local_d8);
            }
            else {
              QTransform::map(&local_d8,(QRegion *)&local_88);
              _Var3._M_head_impl =
                   (this->d_ptr)._M_t.
                   super___uniq_ptr_impl<QPainterPrivate,_std::default_delete<QPainterPrivate>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_QPainterPrivate_*,_std::default_delete<QPainterPrivate>_>.
                   super__Head_base<0UL,_QPainterPrivate_*,_false>._M_head_impl;
              (this->d_ptr)._M_t.
              super___uniq_ptr_impl<QPainterPrivate,_std::default_delete<QPainterPrivate>_>._M_t.
              super__Tuple_impl<0UL,_QPainterPrivate_*,_std::default_delete<QPainterPrivate>_>.
              super__Head_base<0UL,_QPainterPrivate_*,_false>._M_head_impl =
                   (QPainterPrivate *)local_d8.m_matrix[0][0];
              local_d8.m_matrix[0][0] = (qreal)_Var3._M_head_impl;
            }
            QRegion::~QRegion((QRegion *)&local_d8);
          }
          break;
        case 1:
          pqVar13 = (qreal *)&DAT_0069f5a8;
          pQVar14 = &local_88;
          for (lVar11 = 10; lVar11 != 0; lVar11 = lVar11 + -1) {
            pQVar14->m_matrix[0][0] = *pqVar13;
            pqVar13 = pqVar13 + (ulong)bVar17 * -2 + 1;
            pQVar14 = (QTransform *)((long)pQVar14 + ((ulong)bVar17 * -2 + 1) * 8);
          }
          QTransform::operator*(&local_88,(QTransform *)(this_01 + -0xb),pQVar16);
          if (bVar12) {
            QTransform::map((QTransform *)local_118,(QPainterPath *)&local_88);
            pqVar13 = (qreal *)&DAT_0069f560;
            pQVar14 = &local_d8;
            for (lVar11 = 9; lVar11 != 0; lVar11 = lVar11 + -1) {
              pQVar14->m_matrix[0][0] = *pqVar13;
              pqVar13 = pqVar13 + (ulong)bVar17 * -2 + 1;
              pQVar14 = (QTransform *)((long)pQVar14 + ((ulong)bVar17 * -2 + 1) * 8);
            }
            local_d8._72_2_ = local_d8._72_2_ & 0xfc00;
            QPainterPath::toFillPolygon
                      ((QPolygonF *)(local_118 + 8),(QPainterPath *)local_118,&local_d8);
            QPolygonF::toPolygon((QPolygon *)local_f8,(QPolygonF *)(local_118 + 8));
            FVar6 = QPainterPath::fillRule(this_01);
            QRegion::QRegion((QRegion *)(local_f8 + 0x18),(QPolygon *)local_f8,FVar6);
            _Var3._M_head_impl =
                 (this->d_ptr)._M_t.
                 super___uniq_ptr_impl<QPainterPrivate,_std::default_delete<QPainterPrivate>_>._M_t.
                 super__Tuple_impl<0UL,_QPainterPrivate_*,_std::default_delete<QPainterPrivate>_>.
                 super__Head_base<0UL,_QPainterPrivate_*,_false>._M_head_impl;
            (this->d_ptr)._M_t.
            super___uniq_ptr_impl<QPainterPrivate,_std::default_delete<QPainterPrivate>_>._M_t.
            super__Tuple_impl<0UL,_QPainterPrivate_*,_std::default_delete<QPainterPrivate>_>.
            super__Head_base<0UL,_QPainterPrivate_*,_false>._M_head_impl =
                 (QPainterPrivate *)local_f8._24_8_;
            local_f8._24_8_ = _Var3._M_head_impl;
            QRegion::~QRegion((QRegion *)(local_f8 + 0x18));
            if ((QPainterPrivate *)local_f8._0_8_ != (QPainterPrivate *)0x0) {
              LOCK();
              (((RefCount *)local_f8._0_8_)->atomic)._q_value.super___atomic_base<int>._M_i =
                   (((RefCount *)local_f8._0_8_)->atomic)._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if ((((RefCount *)local_f8._0_8_)->atomic)._q_value.super___atomic_base<int>._M_i == 0
                 ) {
                QArrayData::deallocate((QArrayData *)local_f8._0_8_,8,0x10);
              }
            }
            if ((QArrayData *)local_118._8_8_ != (QArrayData *)0x0) {
              LOCK();
              (((QBasicAtomicInt *)local_118._8_8_)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)local_118._8_8_)->_q_value).super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if ((((QBasicAtomicInt *)local_118._8_8_)->_q_value).super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate((QArrayData *)local_118._8_8_,0x10,0x10);
              }
            }
            QPainterPath::~QPainterPath((QPainterPath *)local_118);
            bVar12 = false;
          }
          else {
            iVar8 = *(int *)&this_01[-1].d_ptr.d.ptr;
            if (iVar8 == 0) goto LAB_003d18f5;
            if (iVar8 == 2) {
              QTransform::map((QTransform *)local_118,(QPainterPath *)&local_88);
              pqVar13 = (qreal *)&DAT_0069f560;
              pQVar14 = &local_d8;
              for (lVar11 = 9; lVar11 != 0; lVar11 = lVar11 + -1) {
                pQVar14->m_matrix[0][0] = *pqVar13;
                pqVar13 = pqVar13 + (ulong)bVar17 * -2 + 1;
                pQVar14 = (QTransform *)((long)pQVar14 + ((ulong)bVar17 * -2 + 1) * 8);
              }
              local_d8._72_2_ = local_d8._72_2_ & 0xfc00;
              QPainterPath::toFillPolygon
                        ((QPolygonF *)(local_118 + 8),(QPainterPath *)local_118,&local_d8);
              QPolygonF::toPolygon((QPolygon *)local_f8,(QPolygonF *)(local_118 + 8));
              FVar6 = QPainterPath::fillRule(this_01);
              QRegion::QRegion((QRegion *)(local_f8 + 0x18),(QPolygon *)local_f8,FVar6);
              QRegion::operator&=((QRegion *)this,(QRegion *)(local_f8 + 0x18));
            }
            else {
              QTransform::map((QTransform *)local_118,(QPainterPath *)&local_88);
              pqVar13 = (qreal *)&DAT_0069f560;
              pQVar14 = &local_d8;
              for (lVar11 = 9; lVar11 != 0; lVar11 = lVar11 + -1) {
                pQVar14->m_matrix[0][0] = *pqVar13;
                pqVar13 = pqVar13 + (ulong)bVar17 * -2 + 1;
                pQVar14 = (QTransform *)((long)pQVar14 + ((ulong)bVar17 * -2 + 1) * 8);
              }
              local_d8._72_2_ = local_d8._72_2_ & 0xfc00;
              QPainterPath::toFillPolygon
                        ((QPolygonF *)(local_118 + 8),(QPainterPath *)local_118,&local_d8);
              QPolygonF::toPolygon((QPolygon *)local_f8,(QPolygonF *)(local_118 + 8));
              FVar6 = QPainterPath::fillRule(this_01);
              QRegion::QRegion((QRegion *)(local_f8 + 0x18),(QPolygon *)local_f8,FVar6);
              _Var3._M_head_impl =
                   (this->d_ptr)._M_t.
                   super___uniq_ptr_impl<QPainterPrivate,_std::default_delete<QPainterPrivate>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_QPainterPrivate_*,_std::default_delete<QPainterPrivate>_>.
                   super__Head_base<0UL,_QPainterPrivate_*,_false>._M_head_impl;
              (this->d_ptr)._M_t.
              super___uniq_ptr_impl<QPainterPrivate,_std::default_delete<QPainterPrivate>_>._M_t.
              super__Tuple_impl<0UL,_QPainterPrivate_*,_std::default_delete<QPainterPrivate>_>.
              super__Head_base<0UL,_QPainterPrivate_*,_false>._M_head_impl =
                   (QPainterPrivate *)local_f8._24_8_;
              local_f8._24_8_ = _Var3._M_head_impl;
            }
            QRegion::~QRegion((QRegion *)(local_f8 + 0x18));
            if ((QPainterPrivate *)local_f8._0_8_ != (QPainterPrivate *)0x0) {
              LOCK();
              (((RefCount *)local_f8._0_8_)->atomic)._q_value.super___atomic_base<int>._M_i =
                   (((RefCount *)local_f8._0_8_)->atomic)._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if ((((RefCount *)local_f8._0_8_)->atomic)._q_value.super___atomic_base<int>._M_i == 0
                 ) {
                QArrayData::deallocate((QArrayData *)local_f8._0_8_,8,0x10);
              }
            }
            if ((QArrayData *)local_118._8_8_ != (QArrayData *)0x0) {
              LOCK();
              (((QBasicAtomicInt *)local_118._8_8_)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)local_118._8_8_)->_q_value).super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if ((((QBasicAtomicInt *)local_118._8_8_)->_q_value).super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate((QArrayData *)local_118._8_8_,0x10,0x10);
              }
            }
            QPainterPath::~QPainterPath((QPainterPath *)local_118);
          }
          break;
        case 2:
          pqVar13 = (qreal *)&DAT_0069f5a8;
          pQVar14 = &local_88;
          for (lVar11 = 10; lVar11 != 0; lVar11 = lVar11 + -1) {
            pQVar14->m_matrix[0][0] = *pqVar13;
            pqVar13 = pqVar13 + (ulong)bVar17 * -2 + 1;
            pQVar14 = (QTransform *)((long)pQVar14 + ((ulong)bVar17 * -2 + 1) * 8);
          }
          QTransform::operator*(&local_88,(QTransform *)(this_01 + -0xb),pQVar16);
          if (bVar12) {
            this_00 = (QRegion *)local_f8;
            QRegion::QRegion(this_00,(QRect *)(this_01 + 2),Rectangle);
            QTransform::map(&local_d8,(QRegion *)&local_88);
            _Var3._M_head_impl =
                 (this->d_ptr)._M_t.
                 super___uniq_ptr_impl<QPainterPrivate,_std::default_delete<QPainterPrivate>_>._M_t.
                 super__Tuple_impl<0UL,_QPainterPrivate_*,_std::default_delete<QPainterPrivate>_>.
                 super__Head_base<0UL,_QPainterPrivate_*,_false>._M_head_impl;
            (this->d_ptr)._M_t.
            super___uniq_ptr_impl<QPainterPrivate,_std::default_delete<QPainterPrivate>_>._M_t.
            super__Tuple_impl<0UL,_QPainterPrivate_*,_std::default_delete<QPainterPrivate>_>.
            super__Head_base<0UL,_QPainterPrivate_*,_false>._M_head_impl =
                 (QPainterPrivate *)local_d8.m_matrix[0][0];
            local_d8.m_matrix[0][0] = (qreal)_Var3._M_head_impl;
            QRegion::~QRegion((QRegion *)&local_d8);
LAB_003d1522:
            bVar12 = false;
          }
          else {
            iVar8 = *(int *)&this_01[-1].d_ptr.d.ptr;
            if (iVar8 == 0) goto LAB_003d18e1;
            if (iVar8 == 2) {
              TVar7 = QTransform::type(&local_88);
              r = (QRect *)(this_01 + 2);
              if ((int)TVar7 < 3) {
LAB_003d17e3:
                local_d8.m_matrix[0]._0_16_ = QTransform::mapRect(&local_88,r);
                QRegion::operator&=((QRegion *)this,(QRect *)&local_d8);
                break;
              }
              QRegion::QRegion((QRegion *)local_f8,r,Rectangle);
              QTransform::map(&local_d8,(QRegion *)&local_88);
              QRegion::operator&=((QRegion *)this,(QRegion *)&local_d8);
              QRegion::~QRegion((QRegion *)&local_d8);
              this_00 = (QRegion *)local_f8;
            }
            else {
              this_00 = (QRegion *)local_f8;
              QRegion::QRegion(this_00,(QRect *)(this_01 + 2),Rectangle);
              QTransform::map(&local_d8,(QRegion *)&local_88);
              _Var3._M_head_impl =
                   (this->d_ptr)._M_t.
                   super___uniq_ptr_impl<QPainterPrivate,_std::default_delete<QPainterPrivate>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_QPainterPrivate_*,_std::default_delete<QPainterPrivate>_>.
                   super__Head_base<0UL,_QPainterPrivate_*,_false>._M_head_impl;
              (this->d_ptr)._M_t.
              super___uniq_ptr_impl<QPainterPrivate,_std::default_delete<QPainterPrivate>_>._M_t.
              super__Tuple_impl<0UL,_QPainterPrivate_*,_std::default_delete<QPainterPrivate>_>.
              super__Head_base<0UL,_QPainterPrivate_*,_false>._M_head_impl =
                   (QPainterPrivate *)local_d8.m_matrix[0][0];
              local_d8.m_matrix[0][0] = (qreal)_Var3._M_head_impl;
              QRegion::~QRegion((QRegion *)&local_d8);
            }
          }
LAB_003d1e1e:
          QRegion::~QRegion(this_00);
          break;
        case 3:
          pqVar13 = (qreal *)&DAT_0069f5a8;
          pQVar14 = &local_88;
          for (lVar11 = 10; lVar11 != 0; lVar11 = lVar11 + -1) {
            pQVar14->m_matrix[0][0] = *pqVar13;
            pqVar13 = pqVar13 + (ulong)bVar17 * -2 + 1;
            pQVar14 = (QTransform *)((long)pQVar14 + ((ulong)bVar17 * -2 + 1) * 8);
          }
          QTransform::operator*(&local_88,(QTransform *)(this_01 + -0xb),pQVar16);
          if (bVar12) {
            pQVar1 = this_01[4].d_ptr.d.ptr;
            pQVar2 = this_01[5].d_ptr.d.ptr;
            dVar18 = (double)((ulong)pQVar1 & 0x8000000000000000 | 0x3fe0000000000000) +
                     (double)pQVar1;
            bVar12 = 2147483647.0 < dVar18;
            if (dVar18 <= -2147483648.0) {
              dVar18 = -2147483648.0;
            }
            dVar18 = (double)(-(ulong)bVar12 & 0x41dfffffffc00000 | ~-(ulong)bVar12 & (ulong)dVar18)
            ;
            local_d8.m_matrix[0][0]._0_4_ = (int)dVar18;
            dVar19 = (double)((ulong)pQVar2 & 0x8000000000000000 | 0x3fe0000000000000) +
                     (double)pQVar2;
            bVar12 = 2147483647.0 < dVar19;
            if (dVar19 <= -2147483648.0) {
              dVar19 = -2147483648.0;
            }
            dVar19 = (double)(-(ulong)bVar12 & 0x41dfffffffc00000 | ~-(ulong)bVar12 & (ulong)dVar19)
            ;
            local_d8.m_matrix[0][0]._4_4_ = (int)dVar19;
            dVar18 = ((double)pQVar1 - (double)(int)dVar18) * 0.5 + (double)this_01[6].d_ptr.d.ptr;
            dVar18 = (double)((ulong)dVar18 & 0x8000000000000000 | 0x3fe0000000000000) + dVar18;
            bVar12 = 2147483647.0 < dVar18;
            if (dVar18 <= -2147483648.0) {
              dVar18 = -2147483648.0;
            }
            dVar19 = ((double)pQVar2 - (double)(int)dVar19) * 0.5 + (double)this_01[7].d_ptr.d.ptr;
            dVar19 = (double)((ulong)dVar19 & 0x8000000000000000 | 0x3fe0000000000000) + dVar19;
            bVar4 = 2147483647.0 < dVar19;
            if (dVar19 <= -2147483648.0) {
              dVar19 = -2147483648.0;
            }
            local_d8.m_matrix[0][1]._4_4_ =
                 (int)(double)(-(ulong)bVar4 & 0x41dfffffffc00000 | ~-(ulong)bVar4 & (ulong)dVar19)
                 + local_d8.m_matrix[0][0]._4_4_ + -1;
            local_d8.m_matrix[0][1]._0_4_ =
                 (int)(double)(-(ulong)bVar12 & 0x41dfffffffc00000 | ~-(ulong)bVar12 & (ulong)dVar18
                              ) + local_d8.m_matrix[0][0]._0_4_ + -1;
            this_00 = (QRegion *)(local_118 + 8);
            QRegion::QRegion(this_00,(QRect *)&local_d8,Rectangle);
            QTransform::map((QTransform *)local_f8,(QRegion *)&local_88);
            _Var3._M_head_impl =
                 (this->d_ptr)._M_t.
                 super___uniq_ptr_impl<QPainterPrivate,_std::default_delete<QPainterPrivate>_>._M_t.
                 super__Tuple_impl<0UL,_QPainterPrivate_*,_std::default_delete<QPainterPrivate>_>.
                 super__Head_base<0UL,_QPainterPrivate_*,_false>._M_head_impl;
            (this->d_ptr)._M_t.
            super___uniq_ptr_impl<QPainterPrivate,_std::default_delete<QPainterPrivate>_>._M_t.
            super__Tuple_impl<0UL,_QPainterPrivate_*,_std::default_delete<QPainterPrivate>_>.
            super__Head_base<0UL,_QPainterPrivate_*,_false>._M_head_impl =
                 (QPainterPrivate *)local_f8._0_8_;
            local_f8._0_8_ = _Var3._M_head_impl;
            QRegion::~QRegion((QRegion *)local_f8);
            goto LAB_003d1522;
          }
          iVar8 = *(int *)&this_01[-1].d_ptr.d.ptr;
          if (iVar8 != 0) {
            if (iVar8 == 2) {
              TVar7 = QTransform::type(&local_88);
              if ((int)TVar7 < 3) {
                pQVar1 = this_01[4].d_ptr.d.ptr;
                pQVar2 = this_01[5].d_ptr.d.ptr;
                dVar18 = (double)((ulong)pQVar1 & 0x8000000000000000 | 0x3fe0000000000000) +
                         (double)pQVar1;
                bVar4 = 2147483647.0 < dVar18;
                if (dVar18 <= -2147483648.0) {
                  dVar18 = -2147483648.0;
                }
                dVar18 = (double)(-(ulong)bVar4 & 0x41dfffffffc00000 |
                                 ~-(ulong)bVar4 & (ulong)dVar18);
                iVar8 = (int)dVar18;
                dVar19 = (double)((ulong)pQVar2 & 0x8000000000000000 | 0x3fe0000000000000) +
                         (double)pQVar2;
                bVar4 = 2147483647.0 < dVar19;
                if (dVar19 <= -2147483648.0) {
                  dVar19 = -2147483648.0;
                }
                dVar19 = (double)(-(ulong)bVar4 & 0x41dfffffffc00000 |
                                 ~-(ulong)bVar4 & (ulong)dVar19);
                iVar9 = (int)dVar19;
                dVar18 = ((double)pQVar1 - (double)(int)dVar18) * 0.5 +
                         (double)this_01[6].d_ptr.d.ptr;
                dVar18 = (double)((ulong)dVar18 & 0x8000000000000000 | 0x3fe0000000000000) + dVar18;
                bVar4 = 2147483647.0 < dVar18;
                if (dVar18 <= -2147483648.0) {
                  dVar18 = -2147483648.0;
                }
                dVar19 = ((double)pQVar2 - (double)(int)dVar19) * 0.5 +
                         (double)this_01[7].d_ptr.d.ptr;
                dVar19 = (double)((ulong)dVar19 & 0x8000000000000000 | 0x3fe0000000000000) + dVar19;
                bVar5 = 2147483647.0 < dVar19;
                if (dVar19 <= -2147483648.0) {
                  dVar19 = -2147483648.0;
                }
                local_f8._0_8_ = CONCAT44(iVar9,iVar8);
                local_f8._8_8_ =
                     CONCAT44((int)(double)(-(ulong)bVar5 & 0x41dfffffffc00000 |
                                           ~-(ulong)bVar5 & (ulong)dVar19) + iVar9 + -1,
                              (int)(double)(-(ulong)bVar4 & 0x41dfffffffc00000 |
                                           ~-(ulong)bVar4 & (ulong)dVar18) + iVar8 + -1);
                r = (QRect *)local_f8;
                goto LAB_003d17e3;
              }
              pQVar1 = this_01[4].d_ptr.d.ptr;
              pQVar2 = this_01[5].d_ptr.d.ptr;
              dVar18 = (double)((ulong)pQVar1 & 0x8000000000000000 | 0x3fe0000000000000) +
                       (double)pQVar1;
              bVar4 = 2147483647.0 < dVar18;
              if (dVar18 <= -2147483648.0) {
                dVar18 = -2147483648.0;
              }
              dVar18 = (double)(-(ulong)bVar4 & 0x41dfffffffc00000 | ~-(ulong)bVar4 & (ulong)dVar18)
              ;
              local_d8.m_matrix[0][0]._0_4_ = (int)dVar18;
              dVar19 = (double)((ulong)pQVar2 & 0x8000000000000000 | 0x3fe0000000000000) +
                       (double)pQVar2;
              bVar4 = 2147483647.0 < dVar19;
              if (dVar19 <= -2147483648.0) {
                dVar19 = -2147483648.0;
              }
              dVar19 = (double)(-(ulong)bVar4 & 0x41dfffffffc00000 | ~-(ulong)bVar4 & (ulong)dVar19)
              ;
              local_d8.m_matrix[0][0]._4_4_ = (int)dVar19;
              dVar18 = ((double)pQVar1 - (double)(int)dVar18) * 0.5 + (double)this_01[6].d_ptr.d.ptr
              ;
              dVar18 = (double)((ulong)dVar18 & 0x8000000000000000 | 0x3fe0000000000000) + dVar18;
              bVar4 = 2147483647.0 < dVar18;
              if (dVar18 <= -2147483648.0) {
                dVar18 = -2147483648.0;
              }
              dVar19 = ((double)pQVar2 - (double)(int)dVar19) * 0.5 + (double)this_01[7].d_ptr.d.ptr
              ;
              dVar19 = (double)((ulong)dVar19 & 0x8000000000000000 | 0x3fe0000000000000) + dVar19;
              bVar5 = 2147483647.0 < dVar19;
              if (dVar19 <= -2147483648.0) {
                dVar19 = -2147483648.0;
              }
              local_d8.m_matrix[0][1]._4_4_ =
                   (int)(double)(-(ulong)bVar5 & 0x41dfffffffc00000 | ~-(ulong)bVar5 & (ulong)dVar19
                                ) + local_d8.m_matrix[0][0]._4_4_ + -1;
              local_d8.m_matrix[0][1]._0_4_ =
                   (int)(double)(-(ulong)bVar4 & 0x41dfffffffc00000 | ~-(ulong)bVar4 & (ulong)dVar18
                                ) + local_d8.m_matrix[0][0]._0_4_ + -1;
              QRegion::QRegion((QRegion *)(local_118 + 8),(QRect *)&local_d8,Rectangle);
              QTransform::map((QTransform *)local_f8,(QRegion *)&local_88);
              QRegion::operator&=((QRegion *)this,(QRegion *)local_f8);
              QRegion::~QRegion((QRegion *)local_f8);
              this_00 = (QRegion *)(local_118 + 8);
            }
            else {
              pQVar1 = this_01[4].d_ptr.d.ptr;
              pQVar2 = this_01[5].d_ptr.d.ptr;
              dVar18 = (double)((ulong)pQVar1 & 0x8000000000000000 | 0x3fe0000000000000) +
                       (double)pQVar1;
              bVar4 = 2147483647.0 < dVar18;
              if (dVar18 <= -2147483648.0) {
                dVar18 = -2147483648.0;
              }
              dVar18 = (double)(-(ulong)bVar4 & 0x41dfffffffc00000 | ~-(ulong)bVar4 & (ulong)dVar18)
              ;
              local_d8.m_matrix[0][0]._0_4_ = (int)dVar18;
              dVar19 = (double)((ulong)pQVar2 & 0x8000000000000000 | 0x3fe0000000000000) +
                       (double)pQVar2;
              bVar4 = 2147483647.0 < dVar19;
              if (dVar19 <= -2147483648.0) {
                dVar19 = -2147483648.0;
              }
              dVar19 = (double)(-(ulong)bVar4 & 0x41dfffffffc00000 | ~-(ulong)bVar4 & (ulong)dVar19)
              ;
              local_d8.m_matrix[0][0]._4_4_ = (int)dVar19;
              dVar18 = ((double)pQVar1 - (double)(int)dVar18) * 0.5 + (double)this_01[6].d_ptr.d.ptr
              ;
              dVar18 = (double)((ulong)dVar18 & 0x8000000000000000 | 0x3fe0000000000000) + dVar18;
              bVar4 = 2147483647.0 < dVar18;
              if (dVar18 <= -2147483648.0) {
                dVar18 = -2147483648.0;
              }
              dVar19 = ((double)pQVar2 - (double)(int)dVar19) * 0.5 + (double)this_01[7].d_ptr.d.ptr
              ;
              dVar19 = (double)((ulong)dVar19 & 0x8000000000000000 | 0x3fe0000000000000) + dVar19;
              bVar5 = 2147483647.0 < dVar19;
              if (dVar19 <= -2147483648.0) {
                dVar19 = -2147483648.0;
              }
              local_d8.m_matrix[0][1]._4_4_ =
                   (int)(double)(-(ulong)bVar5 & 0x41dfffffffc00000 | ~-(ulong)bVar5 & (ulong)dVar19
                                ) + local_d8.m_matrix[0][0]._4_4_ + -1;
              local_d8.m_matrix[0][1]._0_4_ =
                   (int)(double)(-(ulong)bVar4 & 0x41dfffffffc00000 | ~-(ulong)bVar4 & (ulong)dVar18
                                ) + local_d8.m_matrix[0][0]._0_4_ + -1;
              this_00 = (QRegion *)(local_118 + 8);
              QRegion::QRegion(this_00,(QRect *)&local_d8,Rectangle);
              QTransform::map((QTransform *)local_f8,(QRegion *)&local_88);
              _Var3._M_head_impl =
                   (this->d_ptr)._M_t.
                   super___uniq_ptr_impl<QPainterPrivate,_std::default_delete<QPainterPrivate>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_QPainterPrivate_*,_std::default_delete<QPainterPrivate>_>.
                   super__Head_base<0UL,_QPainterPrivate_*,_false>._M_head_impl;
              (this->d_ptr)._M_t.
              super___uniq_ptr_impl<QPainterPrivate,_std::default_delete<QPainterPrivate>_>._M_t.
              super__Tuple_impl<0UL,_QPainterPrivate_*,_std::default_delete<QPainterPrivate>_>.
              super__Head_base<0UL,_QPainterPrivate_*,_false>._M_head_impl =
                   (QPainterPrivate *)local_f8._0_8_;
              local_f8._0_8_ = _Var3._M_head_impl;
              QRegion::~QRegion((QRegion *)local_f8);
            }
            goto LAB_003d1e1e;
          }
LAB_003d18e1:
          QRegion::QRegion((QRegion *)&local_d8);
LAB_003d1902:
          _Var3._M_head_impl =
               (this->d_ptr)._M_t.
               super___uniq_ptr_impl<QPainterPrivate,_std::default_delete<QPainterPrivate>_>._M_t.
               super__Tuple_impl<0UL,_QPainterPrivate_*,_std::default_delete<QPainterPrivate>_>.
               super__Head_base<0UL,_QPainterPrivate_*,_false>._M_head_impl;
          (this->d_ptr)._M_t.
          super___uniq_ptr_impl<QPainterPrivate,_std::default_delete<QPainterPrivate>_>._M_t.
          super__Tuple_impl<0UL,_QPainterPrivate_*,_std::default_delete<QPainterPrivate>_>.
          super__Head_base<0UL,_QPainterPrivate_*,_false>._M_head_impl =
               (QPainterPrivate *)local_d8.m_matrix[0][0];
          local_d8.m_matrix[0][0] = (qreal)_Var3._M_head_impl;
          QRegion::~QRegion((QRegion *)&local_d8);
          bVar12 = true;
        }
        this_01 = this_01 + 0x14;
        lVar15 = lVar15 + -0xa0;
      } while (lVar15 != 0);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (QRegion)(QRegionData *)this;
}

Assistant:

QRegion QPainter::clipRegion() const
{
    Q_D(const QPainter);
    if (!d->engine) {
        qWarning("QPainter::clipRegion: Painter not active");
        return QRegion();
    }

    QRegion region;
    bool lastWasNothing = true;

    if (!d->txinv)
        const_cast<QPainter *>(this)->d_ptr->updateInvMatrix();

    // ### Falcon: Use QPainterPath
    for (const QPainterClipInfo &info : std::as_const(d->state->clipInfo)) {
        switch (info.clipType) {

        case QPainterClipInfo::RegionClip: {
            QTransform matrix = (info.matrix * d->invMatrix);
            if (lastWasNothing) {
                region = info.region * matrix;
                lastWasNothing = false;
                continue;
            }
            if (info.operation == Qt::IntersectClip)
                region &= info.region * matrix;
            else if (info.operation == Qt::NoClip) {
                lastWasNothing = true;
                region = QRegion();
            } else
                region = info.region * matrix;
            break;
        }

        case QPainterClipInfo::PathClip: {
            QTransform matrix = (info.matrix * d->invMatrix);
            if (lastWasNothing) {
                region = QRegion((info.path * matrix).toFillPolygon().toPolygon(),
                                 info.path.fillRule());
                lastWasNothing = false;
                continue;
            }
            if (info.operation == Qt::IntersectClip) {
                region &= QRegion((info.path * matrix).toFillPolygon().toPolygon(),
                                  info.path.fillRule());
            } else if (info.operation == Qt::NoClip) {
                lastWasNothing = true;
                region = QRegion();
            } else {
                region = QRegion((info.path * matrix).toFillPolygon().toPolygon(),
                                 info.path.fillRule());
            }
            break;
        }

        case QPainterClipInfo::RectClip: {
            QTransform matrix = (info.matrix * d->invMatrix);
            if (lastWasNothing) {
                region = QRegion(info.rect) * matrix;
                lastWasNothing = false;
                continue;
            }
            if (info.operation == Qt::IntersectClip) {
                // Use rect intersection if possible.
                if (matrix.type() <= QTransform::TxScale)
                    region &= matrix.mapRect(info.rect);
                else
                    region &= matrix.map(QRegion(info.rect));
            } else if (info.operation == Qt::NoClip) {
                lastWasNothing = true;
                region = QRegion();
            } else {
                region = QRegion(info.rect) * matrix;
            }
            break;
        }

        case QPainterClipInfo::RectFClip: {
            QTransform matrix = (info.matrix * d->invMatrix);
            if (lastWasNothing) {
                region = QRegion(info.rectf.toRect()) * matrix;
                lastWasNothing = false;
                continue;
            }
            if (info.operation == Qt::IntersectClip) {
                // Use rect intersection if possible.
                if (matrix.type() <= QTransform::TxScale)
                    region &= matrix.mapRect(info.rectf.toRect());
                else
                    region &= matrix.map(QRegion(info.rectf.toRect()));
            } else if (info.operation == Qt::NoClip) {
                lastWasNothing = true;
                region = QRegion();
            } else {
                region = QRegion(info.rectf.toRect()) * matrix;
            }
            break;
        }
        }
    }

    return region;
}